

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr)

{
  u8 uVar1;
  uint uVar2;
  Vdbe *p;
  Select *p_00;
  Expr *pEVar3;
  VdbeOp *pVVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  SelectDest local_50;
  
  p = pParse->pVdbe;
  p_00 = (pExpr->x).pSelect;
  uVar2 = pExpr->flags;
  iVar5 = 0;
  if ((uVar2 & 0x20) == 0) {
    if ((uVar2 >> 0x19 & 1) != 0) {
      sqlite3VdbeExplain(pParse,'\0',"REUSE SUBQUERY %d",(ulong)p_00->selId);
      sqlite3VdbeAddOp2(p,0xc,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr);
      return pExpr->iTable;
    }
    pExpr->flags = uVar2 | 0x2000000;
    iVar5 = pParse->nMem + 1;
    pParse->nMem = iVar5;
    (pExpr->y).sub.regReturn = iVar5;
    iVar5 = sqlite3VdbeAddOp2(p,0x46,0,iVar5);
    (pExpr->y).sub.iAddr = iVar5 + 1;
    iVar5 = sqlite3VdbeAddOp0(p,0x11);
  }
  pcVar6 = "";
  if (iVar5 == 0) {
    pcVar6 = "CORRELATED ";
  }
  iVar8 = 1;
  sqlite3VdbeExplain(pParse,'\x01',"%sSCALAR SUBQUERY %d",pcVar6,(ulong)p_00->selId);
  uVar1 = pExpr->op;
  if (uVar1 == 0x83) {
    iVar8 = p_00->pEList->nExpr;
  }
  local_50.iSDParm = pParse->nMem + 1;
  iVar7 = pParse->nMem + iVar8;
  local_50.iSdst = 0;
  local_50.nSdst = 0;
  local_50.zAffSdst = (char *)0x0;
  pParse->nMem = iVar7;
  if (uVar1 == 0x83) {
    local_50.nSdst = iVar8;
    local_50.iSdst = local_50.iSDParm;
    sqlite3VdbeAddOp3(p,0x49,0,local_50.iSDParm,iVar7);
    local_50.eDest = '\n';
  }
  else {
    sqlite3VdbeAddOp2(p,0x46,0,local_50.iSDParm);
    local_50.eDest = '\x03';
  }
  pEVar3 = sqlite3ExprAlloc(pParse->db,0x93,sqlite3IntTokens + 1,0);
  if (p_00->pLimit == (Expr *)0x0) {
    pEVar3 = sqlite3PExpr(pParse,0x8d,pEVar3,(Expr *)0x0);
    p_00->pLimit = pEVar3;
  }
  else {
    sqlite3ExprDelete(pParse->db,p_00->pLimit->pLeft);
    p_00->pLimit->pLeft = pEVar3;
  }
  p_00->iLimit = 0;
  iVar7 = sqlite3Select(pParse,p_00,&local_50);
  iVar8 = 0;
  if ((iVar7 == 0) && (pExpr->iTable = local_50.iSDParm, iVar8 = local_50.iSDParm, iVar5 != 0)) {
    sqlite3VdbeJumpHere(p,iVar5);
    sqlite3VdbeAddOp1(p,0x42,(pExpr->y).sub.regReturn);
    iVar5 = p->nOp;
    pVVar4 = sqlite3VdbeGetOp(p,(pExpr->y).sub.iAddr + -1);
    pVVar4->p1 = iVar5 + -1;
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(Parse *pParse, Expr *pExpr){
  int addrOnce = 0;           /* Address of OP_Once at top of subroutine */
  int rReg = 0;               /* Register storing resulting */
  Select *pSel;               /* SELECT statement to encode */
  SelectDest dest;            /* How to deal with SELECT result */
  int nReg;                   /* Registers to allocate */
  Expr *pLimit;               /* New limit expression */

  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  testcase( pExpr->op==TK_EXISTS );
  testcase( pExpr->op==TK_SELECT );
  assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
  assert( ExprHasProperty(pExpr, EP_xIsSelect) );
  pSel = pExpr->x.pSelect;

  /* The evaluation of the EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    /* If this routine has already been coded, then invoke it as a
    ** subroutine. */
    if( ExprHasProperty(pExpr, EP_Subrtn) ){
      ExplainQueryPlan((pParse, 0, "REUSE SUBQUERY %d", pSel->selId));
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      return pExpr->iTable;
    }

    /* Begin coding the subroutine */
    ExprSetProperty(pExpr, EP_Subrtn);
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pExpr->y.sub.regReturn) + 1;
    VdbeComment((v, "return address"));

    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }
  
  /* For a SELECT, generate code to put the values for all columns of
  ** the first row into an array of registers and return the index of
  ** the first register.
  **
  ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
  ** into a register and return that register number.
  **
  ** In both cases, the query is augmented with "LIMIT 1".  Any 
  ** preexisting limit is discarded in place of the new LIMIT 1.
  */
  ExplainQueryPlan((pParse, 1, "%sSCALAR SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSel->selId));
  nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
  sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
  pParse->nMem += nReg;
  if( pExpr->op==TK_SELECT ){
    dest.eDest = SRT_Mem;
    dest.iSdst = dest.iSDParm;
    dest.nSdst = nReg;
    sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
    VdbeComment((v, "Init subquery result"));
  }else{
    dest.eDest = SRT_Exists;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
    VdbeComment((v, "Init EXISTS result"));
  }
  pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,&sqlite3IntTokens[1], 0);
  if( pSel->pLimit ){
    sqlite3ExprDelete(pParse->db, pSel->pLimit->pLeft);
    pSel->pLimit->pLeft = pLimit;
  }else{
    pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
  }
  pSel->iLimit = 0;
  if( sqlite3Select(pParse, pSel, &dest) ){
    return 0;
  }
  pExpr->iTable = rReg = dest.iSDParm;
  ExprSetVVAProperty(pExpr, EP_NoReduce);
  if( addrOnce ){
    sqlite3VdbeJumpHere(v, addrOnce);

    /* Subroutine return */
    sqlite3VdbeAddOp1(v, OP_Return, pExpr->y.sub.regReturn);
    sqlite3VdbeChangeP1(v, pExpr->y.sub.iAddr-1, sqlite3VdbeCurrentAddr(v)-1);
  }

  return rReg;
}